

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_front.c
# Opt level: O2

PaError Pa_StopStream(PaStream *stream)

{
  PaError PVar1;
  int iVar2;
  
  PVar1 = PaUtil_ValidateStreamPointer(stream);
  if (PVar1 == 0) {
    iVar2 = (**(code **)(*(long *)((long)stream + 0x10) + 0x20))(stream);
    if (iVar2 == 0) {
      PVar1 = (**(code **)(*(long *)((long)stream + 0x10) + 0x10))(stream);
      return PVar1;
    }
    PVar1 = -0x26ff;
    if (iVar2 != 1) {
      PVar1 = iVar2;
    }
  }
  return PVar1;
}

Assistant:

PaError Pa_StopStream( PaStream *stream )
{
    PaError result = PaUtil_ValidateStreamPointer( stream );

    PA_LOGAPI_ENTER_PARAMS( "Pa_StopStream" );
    PA_LOGAPI(("\tPaStream* stream: 0x%p\n", stream ));

    if( result == paNoError )
    {
        result = PA_STREAM_INTERFACE(stream)->IsStopped( stream );
        if( result == 0 )
        {
            result = PA_STREAM_INTERFACE(stream)->Stop( stream );
        }
        else if( result == 1 )
        {
            result = paStreamIsStopped;
        }
    }

    PA_LOGAPI_EXIT_PAERROR( "Pa_StopStream", result );

    return result;
}